

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuScreenResolutionLine::MenuEvent
          (FOptionMenuScreenResolutionLine *this,int mkey,bool fromcontroller)

{
  int iVar1;
  float fVar2;
  FSoundID local_28;
  FSoundID local_24;
  undefined1 local_1d;
  int local_1c;
  bool fromcontroller_local;
  FOptionMenuScreenResolutionLine *pFStack_18;
  int mkey_local;
  FOptionMenuScreenResolutionLine *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pFStack_18 = this;
  if (mkey == 2) {
    iVar1 = this->mSelection + -1;
    this->mSelection = iVar1;
    if (iVar1 < 0) {
      this->mSelection = this->mMaxValid;
    }
    FSoundID::FSoundID(&local_24,"menu/cursor");
    fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_24,fVar2,0.0);
    this_local._7_1_ = true;
  }
  else if (mkey == 3) {
    iVar1 = this->mSelection + 1;
    this->mSelection = iVar1;
    if (this->mMaxValid < iVar1) {
      this->mSelection = 0;
    }
    FSoundID::FSoundID(&local_28,"menu/cursor");
    fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_28,fVar2,0.0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
  }
  return this_local._7_1_;
}

Assistant:

bool MenuEvent (int mkey, bool fromcontroller)
	{
		if (mkey == MKEY_Left)
		{
			if (--mSelection < 0) mSelection = mMaxValid;
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			return true;
		}
		else if (mkey == MKEY_Right)
		{
			if (++mSelection > mMaxValid) mSelection = 0;
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			return true;
		}
		else 
		{
			return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
		}
		return false;
	}